

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdType.cpp
# Opt level: O1

void __thiscall Id::Id(Id *this,string *name,TYPE type)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->type = type;
  return;
}

Assistant:

Id::Id(std::string name, TYPE type) {
    this->name = std::move(name);
    this->type = type;
}